

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

void __thiscall embree::Texture::Texture(Texture *this)

{
  this->width = 0xffffffff;
  this->height = 0xffffffff;
  this->format = INVALID;
  this->bytesPerTexel = 0;
  this->width_mask = 0;
  this->height_mask = 0;
  this->data = (void *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Texture::Texture () 
    : width(-1), height(-1), format(INVALID), bytesPerTexel(0), width_mask(0), height_mask(0), data(nullptr) {}